

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionDispatcher.cpp
# Opt level: O3

void __thiscall
btCollisionDispatcher::btCollisionDispatcher
          (btCollisionDispatcher *this,btCollisionConfiguration *collisionConfiguration)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  btCollisionAlgorithmCreateFunc *(*papbVar2) [36];
  ulong uVar3;
  int j;
  ulong uVar4;
  
  (this->super_btDispatcher)._vptr_btDispatcher = (_func_int **)&PTR__btCollisionDispatcher_0021b8a0
  ;
  this->m_dispatcherFlags = 2;
  (this->m_manifoldsPtr).m_ownsMemory = true;
  (this->m_manifoldsPtr).m_data = (btPersistentManifold **)0x0;
  (this->m_manifoldsPtr).m_size = 0;
  (this->m_manifoldsPtr).m_capacity = 0;
  (this->m_defaultManifoldResult).super_Result._vptr_Result = (_func_int **)&PTR__Result_0021ca80;
  this->m_collisionConfiguration = collisionConfiguration;
  this->m_nearCallback = defaultNearCallback;
  iVar1 = (*collisionConfiguration->_vptr_btCollisionConfiguration[3])(collisionConfiguration);
  this->m_collisionAlgorithmPoolAllocator = (btPoolAllocator *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*collisionConfiguration->_vptr_btCollisionConfiguration[2])(collisionConfiguration);
  this->m_persistentManifoldPoolAllocator = (btPoolAllocator *)CONCAT44(extraout_var_00,iVar1);
  papbVar2 = this->m_doubleDispatch;
  uVar3 = 0;
  do {
    uVar4 = 0;
    do {
      iVar1 = (*this->m_collisionConfiguration->_vptr_btCollisionConfiguration[4])
                        (this->m_collisionConfiguration,uVar3 & 0xffffffff,uVar4 & 0xffffffff);
      (*papbVar2)[uVar4] = (btCollisionAlgorithmCreateFunc *)CONCAT44(extraout_var_01,iVar1);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x24);
    uVar3 = uVar3 + 1;
    papbVar2 = papbVar2 + 1;
  } while (uVar3 != 0x24);
  return;
}

Assistant:

btCollisionDispatcher::btCollisionDispatcher (btCollisionConfiguration* collisionConfiguration): 
m_dispatcherFlags(btCollisionDispatcher::CD_USE_RELATIVE_CONTACT_BREAKING_THRESHOLD),
	m_collisionConfiguration(collisionConfiguration)
{
	int i;

	setNearCallback(defaultNearCallback);
	
	m_collisionAlgorithmPoolAllocator = collisionConfiguration->getCollisionAlgorithmPool();

	m_persistentManifoldPoolAllocator = collisionConfiguration->getPersistentManifoldPool();

	for (i=0;i<MAX_BROADPHASE_COLLISION_TYPES;i++)
	{
		for (int j=0;j<MAX_BROADPHASE_COLLISION_TYPES;j++)
		{
			m_doubleDispatch[i][j] = m_collisionConfiguration->getCollisionAlgorithmCreateFunc(i,j);
			btAssert(m_doubleDispatch[i][j]);
		}
	}
	
	
}